

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsOpaqueType(Instruction *this)

{
  Op opcode;
  bool bVar1;
  uint32_t id;
  DefUseManager *this_00;
  undefined1 local_39;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  while (opcode = this->opcode_, opcode == OpTypeArray) {
    id = GetSingleWordInOperand(this,0);
    this_00 = IRContext::get_def_use_mgr(this->context_);
    this = analysis::DefUseManager::GetDef(this_00,id);
  }
  if (opcode == OpTypeRuntimeArray) {
    local_39 = 1;
  }
  else {
    if (opcode != OpTypeStruct) {
      bVar1 = spvOpcodeIsBaseOpaqueType(opcode);
      return bVar1;
    }
    local_38._M_unused._M_object = &local_39;
    local_39 = 0;
    local_20 = std::
               _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:737:22)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:737:22)>
               ::_M_manager;
    local_38._8_8_ = this;
    ForEachInOperand(this,(function<void_(const_unsigned_int_*)> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  return (bool)local_39;
}

Assistant:

bool Instruction::IsOpaqueType() const {
  if (opcode() == spv::Op::OpTypeStruct) {
    bool is_opaque = false;
    ForEachInOperand([&is_opaque, this](const uint32_t* op_id) {
      Instruction* type_inst = context()->get_def_use_mgr()->GetDef(*op_id);
      is_opaque |= type_inst->IsOpaqueType();
    });
    return is_opaque;
  } else if (opcode() == spv::Op::OpTypeArray) {
    uint32_t sub_type_id = GetSingleWordInOperand(0);
    Instruction* sub_type_inst =
        context()->get_def_use_mgr()->GetDef(sub_type_id);
    return sub_type_inst->IsOpaqueType();
  } else {
    return opcode() == spv::Op::OpTypeRuntimeArray ||
           spvOpcodeIsBaseOpaqueType(opcode());
  }
}